

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int decodeBase31(char *code)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    bVar1 = *code;
    if ((bVar1 == 0) || (bVar1 == 0x2e)) break;
    code = (char *)((byte *)code + 1);
    iVar2 = (int)(char)decodeChar_decode_chars[bVar1] + iVar2 * 0x1f;
  }
  return iVar2;
}

Assistant:

static int decodeBase31(const char *code) {
    int value = 0;
    ASSERT(code);
    while (*code != '.' && *code != 0) {
        value = value * 31 + decodeChar(*code++);
    }
    return value;
}